

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj * getobj(char *let,char *word,obj **ostack)

{
  int iVar1;
  obj_use_status oVar2;
  char *pcVar3;
  long lVar4;
  long *local_420;
  char *local_410;
  int *local_408;
  long local_3f0;
  long ctmp;
  char *allowed_choices;
  char local_3d6;
  boolean prezero;
  int cnt;
  xchar foox;
  boolean useboulder;
  char nonechar;
  boolean allownone;
  boolean allowall;
  char *pcStack_3d0;
  xchar allowcnt;
  char *bp;
  char **ppcStack_3c0;
  int foo;
  char *ap;
  char altlets [256];
  char lets [256];
  char qbuf [128];
  char buf [256];
  obj *poStack_30;
  char ilet;
  obj *otmp;
  obj **ostack_local;
  char *word_local;
  char *let_local;
  
  bp._4_4_ = 0;
  pcStack_3d0 = qbuf + 0x78;
  cnt._0_1_ = '-';
  prezero = '\0';
  local_3d6 = '\0';
  allowed_choices._3_1_ = '\0';
  cnt._3_1_ = *let == '\x13';
  word_local = let;
  if ((bool)cnt._3_1_) {
    word_local = let + 1;
  }
  cnt._2_1_ = *word_local == '\x14';
  if ((bool)cnt._2_1_) {
    word_local = word_local + 1;
  }
  cnt._1_1_ = *word_local == '\x15';
  if ((bool)cnt._1_1_) {
    word_local = word_local + 1;
  }
  if (*word_local == '\x16') {
    word_local = word_local + 1;
    cnt._0_1_ = ',';
  }
  if (((bool)cnt._2_1_) && (iVar1 = strcmp(word,"read"), iVar1 == 0)) {
    cnt._2_1_ = '\0';
  }
  if (((*word_local == '\x02') && (iVar1 = strcmp(word,"throw"), iVar1 == 0)) &&
     (((youmonst.data)->mflags2 & 0x8000000) != 0)) {
    prezero = '\x01';
  }
  if (cnt._1_1_ != '\0') {
    *pcStack_3d0 = (char)cnt;
    pcStack_3d0 = pcStack_3d0 + 1;
  }
  if ((qbuf + 0x78 < pcStack_3d0) && (pcStack_3d0[-1] == (char)cnt)) {
    *pcStack_3d0 = ' ';
    pcStack_3d0 = pcStack_3d0 + 1;
  }
  ppcStack_3c0 = &ap;
  buf[0xff] = 'a';
  for (poStack_30 = invent; poStack_30 != (obj *)0x0; poStack_30 = poStack_30->nobj) {
    if (((*word_local == '\0') ||
        (pcVar3 = strchr(word_local,(int)poStack_30->oclass), pcVar3 != (char *)0x0)) ||
       ((prezero != '\0' && (poStack_30->otyp == 0x214)))) {
      lVar4 = (long)bp._4_4_;
      bp._4_4_ = bp._4_4_ + 1;
      pcStack_3d0[lVar4] = poStack_30->invlet;
      oVar2 = object_selection_checks(poStack_30,word);
      if (oVar2 - ALREADY_IN_USE < 2) {
        bp._4_4_ = bp._4_4_ + -1;
        local_3d6 = local_3d6 + '\x01';
      }
      else if (oVar2 == UNSUITABLE_USE) {
        bp._4_4_ = bp._4_4_ + -1;
      }
      else if (oVar2 == CURRENTLY_NOT_USABLE) {
        bp._4_4_ = bp._4_4_ + -1;
        cnt._2_1_ = '\x01';
        *(char *)ppcStack_3c0 = poStack_30->invlet;
        ppcStack_3c0 = (char **)((long)ppcStack_3c0 + 1);
      }
    }
    else {
      iVar1 = strcmp(word,"read");
      if ((iVar1 == 0) &&
         (((((((poStack_30->otyp == 0x122 || (poStack_30->otyp == 0x7b)) ||
              (poStack_30->otyp == 0x129)) ||
             ((poStack_30->otyp == 0xf5 || (poStack_30->otyp == 0x121)))) ||
            (poStack_30->otyp == 0xe4)) || ((poStack_30->otyp == 0xf7 || (poStack_30->otyp == 0xc)))
           ) || ((poStack_30->oartifact == '#' ||
                 ((obj_descr[objects[poStack_30->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
                  (iVar1 = strncmp(obj_descr[objects[poStack_30->otyp].oc_descr_idx].oc_descr,
                                   "runed",5), iVar1 == 0)))))))) {
        cnt._2_1_ = '\x01';
      }
    }
    if (buf[0xff] == 'z') {
      buf[0xff] = 'A';
    }
    else {
      buf[0xff] = buf[0xff] + '\x01';
    }
  }
  pcStack_3d0[bp._4_4_] = '\0';
  if (((bp._4_4_ == 0) && (qbuf + 0x78 < pcStack_3d0)) && (pcStack_3d0[-1] == ' ')) {
    pcStack_3d0[-1] = '\0';
    pcStack_3d0 = pcStack_3d0 + -1;
  }
  strcpy(altlets + 0xf8,pcStack_3d0);
  if (5 < bp._4_4_) {
    compactify(pcStack_3d0);
  }
  *(undefined1 *)ppcStack_3c0 = 0;
  if (((bp._4_4_ == 0) && (cnt._2_1_ == '\0')) && (cnt._1_1_ == '\0')) {
    pcVar3 = "";
    if (local_3d6 != '\0') {
      pcVar3 = "else ";
    }
    pline("You don\'t have anything %sto %s.",pcVar3,word);
    return (obj *)0x0;
  }
LAB_001f56bc:
  allowed_choices._4_4_ = 0;
  if (cnt._3_1_ == '\x02') {
    cnt._3_1_ = '\x01';
  }
  check_tutorial_message(0x10b);
  if (qbuf[0x78] == '\0') {
    sprintf(lets + 0xf8,"What do you want to %s? [*]",word);
  }
  else {
    sprintf(lets + 0xf8,"What do you want to %s? [%s or ?*]",word,qbuf + 0x78);
  }
  if (cnt._3_1_ == '\0') {
    local_408 = (int *)0x0;
  }
  else {
    local_408 = (int *)((long)&allowed_choices + 4);
  }
  buf[0xff] = query_key(lets + 0xf8,local_408);
  if (((cnt._3_1_ == '\x01') && (allowed_choices._4_4_ != -1)) &&
     (cnt._3_1_ = '\x02', allowed_choices._4_4_ == 0)) {
    allowed_choices._3_1_ = '\x01';
  }
  if (allowed_choices._4_4_ == -1) {
    allowed_choices._4_4_ = 0;
  }
  pcVar3 = strchr(" \r\n\x1b",(int)buf[0xff]);
  if (pcVar3 != (char *)0x0) {
    if (flags.verbose != '\0') {
      pline("Never mind.");
    }
    return (obj *)0x0;
  }
  if (buf[0xff] == (char)cnt) {
    if (cnt._1_1_ == '\0') {
      return (obj *)0x0;
    }
    return &zeroobj;
  }
  if (buf[0xff] == '$') {
    if ((allowed_choices._4_4_ == 0) && (allowed_choices._3_1_ != '\0')) {
      return (obj *)0x0;
    }
    if (allowed_choices._4_4_ < 0) {
      pline("The LRS would be very interested to know you have that much.");
      return (obj *)0x0;
    }
  }
  if ((buf[0xff] == '?') || (buf[0xff] == '*')) goto LAB_001f5891;
  goto LAB_001f59c2;
LAB_001f5891:
  if (buf[0xff] == '?') {
    local_410 = altlets + 0xf8;
  }
  else {
    local_410 = (char *)0x0;
  }
  ctmp = (long)local_410;
  local_3f0 = 0;
  if (((buf[0xff] == '?') && (altlets[0xf8] == '\0')) && ((char)ap != '\0')) {
    ctmp = (long)&ap;
  }
  if (cnt._3_1_ == '\0') {
    local_420 = (long *)0x0;
  }
  else {
    local_420 = &local_3f0;
  }
  buf[0xff] = display_pickinv((char *)ctmp,'\x01',local_420);
  if (buf[0xff] != '\0') {
    if ((cnt._3_1_ != '\0') && (-1 < local_3f0)) {
      allowed_choices._4_4_ = (int)local_3f0;
      if (allowed_choices._4_4_ == 0) {
        allowed_choices._3_1_ = '\x01';
      }
      cnt._3_1_ = '\x02';
    }
    if (buf[0xff] == '\x1b') {
      if (flags.verbose != '\0') {
        pline("Never mind.");
      }
      return (obj *)0x0;
    }
LAB_001f59c2:
    if ((cnt._3_1_ == '\x02') && (iVar1 = strcmp(word,"throw"), iVar1 == 0)) {
      if (buf[0xff] != '$') {
        cnt._3_1_ = '\x01';
      }
      if ((allowed_choices._4_4_ == 0) && (allowed_choices._3_1_ != '\0')) {
        return (obj *)0x0;
      }
      if (1 < allowed_choices._4_4_) {
        pline("You can only throw one item at a time.");
        goto LAB_001f56bc;
      }
    }
    iflags.botl = '\x01';
    for (poStack_30 = invent; (poStack_30 != (obj *)0x0 && (poStack_30->invlet != buf[0xff]));
        poStack_30 = poStack_30->nobj) {
    }
    if (poStack_30 == (obj *)0x0) {
      pline("You don\'t have that object.");
    }
    else {
      if ((-1 < allowed_choices._4_4_) && (allowed_choices._4_4_ <= poStack_30->quan)) {
        if (((cnt._2_1_ == '\0') && (word_local != (char *)0x0)) &&
           (pcVar3 = strchr(word_local,(int)poStack_30->oclass), pcVar3 == (char *)0x0)) {
          silly_thing(word,poStack_30);
          return (obj *)0x0;
        }
        if (cnt._3_1_ == '\x02') {
          if (allowed_choices._4_4_ == 0) {
            return (obj *)0x0;
          }
          if (allowed_choices._4_4_ != poStack_30->quan) {
            if ((poStack_30->otyp == 0x210) && ((*(uint *)&poStack_30->field_0x4a & 1) != 0)) {
              poStack_30->corpsenm = allowed_choices._4_4_;
            }
            else {
              iVar1 = welded(poStack_30);
              if (iVar1 == 0) {
                if (ostack != (obj **)0x0) {
                  *ostack = poStack_30;
                }
                poStack_30 = splitobj(poStack_30,(long)allowed_choices._4_4_);
              }
            }
          }
        }
        return poStack_30;
      }
      pline("You don\'t have that many!  You have only %ld.",(ulong)(uint)poStack_30->quan);
    }
  }
  goto LAB_001f56bc;
}

Assistant:

struct obj *getobj(const char *let, const char *word, struct obj **ostack)
{
	struct obj *otmp;
	char ilet;
	char buf[BUFSZ], qbuf[QBUFSZ];
	char lets[BUFSZ], altlets[BUFSZ], *ap;
	int foo = 0;
	char *bp = buf;
	xchar allowcnt = 0;	/* 0, 1 or 2 */
	boolean allowall = FALSE;
	boolean allownone = FALSE;
	char nonechar = '-';
	boolean useboulder = FALSE;
	xchar foox = 0;
	int cnt;
	boolean prezero = FALSE;

	if (*let == ALLOW_COUNT) let++, allowcnt = 1;
	if (*let == ALL_CLASSES) let++, allowall = TRUE;
	if (*let == ALLOW_NONE) let++, allownone = TRUE;
	if (*let == NONE_ON_COMMA) let++, nonechar = ',';
	/* "ugly check" for reading fortune cookies, part 1 */
	/* The normal 'ugly check' keeps the object on the inventory list.
	 * We don't want to do that for shirts/cookies, so the check for
	 * them is handled a bit differently (and also requires that we set
	 * allowall in the caller)
	 */
	if (allowall && !strcmp(word, "read")) allowall = FALSE;

	/* another ugly check: show boulders (not statues) */
	if (*let == WEAPON_CLASS &&
	   !strcmp(word, "throw") && throws_rocks(youmonst.data))
	    useboulder = TRUE;

	if (allownone) *bp++ = nonechar;
	if (bp > buf && bp[-1] == nonechar) *bp++ = ' ';
	ap = altlets;

	ilet = 'a';
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!*let || strchr(let, otmp->oclass)
		|| (useboulder && otmp->otyp == BOULDER)) {
		bp[foo++] = otmp->invlet;
		
		switch (object_selection_checks(otmp, word)) {
		    case ALREADY_IN_USE: /* eg: wield the weapon in your hands */
		    case ARMOR_TAKEOFF_BLOCKED:
			foo--;
			foox++;
			break;
			
		    case UNSUITABLE_USE: /* eg: putting on a tool */
			foo--;
			break;
		    
		    case CURRENTLY_NOT_USABLE:
			foo--;
			allowall = TRUE;
			*ap++ = otmp->invlet;
			break;
			
		    default: break;
		}

	    } else {

		/* "ugly check" for reading fortune cookies, part 2 */
		if (!strcmp(word, "read") &&
		    (otmp->otyp == FORTUNE_COOKIE ||
		     otmp->otyp == T_SHIRT ||
		     otmp->otyp == TIN ||
		     otmp->otyp == CAN_OF_GREASE ||
		     otmp->otyp == CANDY_BAR ||
		     otmp->otyp == CREDIT_CARD ||
		     otmp->otyp == MAGIC_MARKER ||
		     otmp->otyp == COIN_CLASS ||
		     otmp->oartifact == ART_ORB_OF_FATE ||
		     (OBJ_DESCR(objects[otmp->otyp]) &&
		      !strncmp(OBJ_DESCR(objects[otmp->otyp]), "runed", 5))))
			allowall = TRUE;
	    }

	    if (ilet == 'z') ilet = 'A'; else ilet++;
	}
	bp[foo] = 0;
	if (foo == 0 && bp > buf && bp[-1] == ' ') *--bp = 0;
	strcpy(lets, bp);	/* necessary since we destroy buf */
	if (foo > 5)			/* compactify string */
		compactify(bp);
	*ap = '\0';

	if (!foo && !allowall && !allownone) {
		pline("You don't have anything %sto %s.",
			foox ? "else " : "", word);
		return NULL;
	}
	for (;;) {
		cnt = 0;
		if (allowcnt == 2)
		    allowcnt = 1;  /* abort previous count */
		check_tutorial_message(QT_T_CHOOSEITEM);
		if (!buf[0]) {
			sprintf(qbuf, "What do you want to %s? [*]", word);
		} else {
			sprintf(qbuf, "What do you want to %s? [%s or ?*]",
				word, buf);
		}
		ilet = query_key(qbuf, allowcnt ? &cnt : NULL);
		if (allowcnt == 1 && cnt != -1) {
		    allowcnt = 2; /* signal presence of cnt */
		    if (cnt == 0)
			prezero = TRUE; /* cnt was explicitly set to 0 */
		}
		if (cnt == -1)
		    cnt = 0;
		
		if (strchr(quitchars,ilet)) {
		    if (flags.verbose)
			pline("Never mind.");
		    return NULL;
		}
		if (ilet == nonechar) {
			return allownone ? &zeroobj : NULL;
		}
		if (ilet == def_oc_syms[COIN_CLASS]) {
			if (cnt == 0 && prezero) return NULL;
			/* Historic note: early Nethack had a bug which was
			 * first reported for Larn, where trying to drop 2^32-n
			 * gold pieces was allowed, and did interesting things
			 * to your money supply.  The LRS is the tax bureau
			 * from Larn.
			 */
			if (cnt < 0) {
	pline("The LRS would be very interested to know you have that much.");
				return NULL;
			}
		}
		if (ilet == '?' || ilet == '*') {
		    char *allowed_choices = (ilet == '?') ? lets : NULL;
		    long ctmp = 0;

		    if (ilet == '?' && !*lets && *altlets)
			allowed_choices = altlets;
		    ilet = display_pickinv(allowed_choices, TRUE,
					   allowcnt ? &ctmp : NULL);
		    if (!ilet) continue;
		    if (allowcnt && ctmp >= 0) {
			cnt = ctmp;
			if (!cnt) prezero = TRUE;
			allowcnt = 2;
		    }
		    if (ilet == '\033') {
			if (flags.verbose)
			    pline("Never mind.");
			return NULL;
		    }
		    /* they typed a letter (not a space) at the prompt */
		}
		if (allowcnt == 2 && !strcmp(word,"throw")) {
		    /* permit counts for throwing gold, but don't accept
		     * counts for other things since the throw code will
		     * split off a single item anyway */
		    if (ilet != def_oc_syms[COIN_CLASS])
			allowcnt = 1;
		    if (cnt == 0 && prezero) return NULL;
		    if (cnt > 1) {
			pline("You can only throw one item at a time.");
			continue;
		    }
		}
		iflags.botl = 1; /* May have changed the amount of money */

		for (otmp = invent; otmp; otmp = otmp->nobj)
			if (otmp->invlet == ilet) break;
		if (!otmp) {
			pline("You don't have that object.");
			continue;
		} else if (cnt < 0 || otmp->quan < cnt) {
			pline("You don't have that many!  You have only %ld.",
			    otmp->quan);
			continue;
		}
		break;
	}
	if (!allowall && let && !strchr(let,otmp->oclass)) {
		silly_thing(word, otmp);
		return NULL;
	}
	if (allowcnt == 2) {	/* cnt given */
	    if (cnt == 0) return NULL;
	    if (cnt != otmp->quan) {
		/* don't split a stack of cursed loadstones */
		if (otmp->otyp == LOADSTONE && otmp->cursed) {
		    /* kludge for canletgo()'s can't-drop-this message */
		    otmp->corpsenm = (int) cnt;
		} else if (welded(otmp)) {
		    /* don't split a stack of wielded, cursed weapons */
		} else {
		    if (ostack) *ostack = otmp;
		    otmp = splitobj(otmp, cnt);
		}
	    }
	}
	return otmp;
}